

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFFormFieldObjectHelper::setRadioButtonValue
          (QPDFFormFieldObjectHelper *this,QPDFObjectHandle *name)

{
  BaseHandle *pBVar1;
  string *__return_storage_ptr__;
  bool bVar2;
  iterator key;
  iterator key_00;
  iterator iVar3;
  QPDFFormFieldObjectHelper ph;
  QPDFObjectHandle annot;
  QPDFObjectHandle parent;
  QPDFObjectHandle kids;
  QPDFObjectHandle AP;
  allocator<char> local_172;
  allocator<char> local_171;
  string local_170;
  QPDFFormFieldObjectHelper local_150;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_118;
  QPDFObjectHandle local_100;
  undefined1 local_f0 [24];
  string local_d8;
  QPDFObjectHandle local_b8;
  QPDFObjectHandle local_a8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *local_98;
  string *local_90;
  undefined1 local_88 [32];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_58;
  Array local_48;
  
  pBVar1 = &(this->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_170,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"/Parent",(allocator<char> *)(local_f0 + 0x18));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_f0,&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_170._M_string_length);
  bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_f0);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"/Parent",(allocator<char> *)(local_f0 + 0x18));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_170,(string *)local_f0);
    bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)&local_170);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_170._M_string_length);
    std::__cxx11::string::~string((string *)&local_150);
    if (bVar2) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_58,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_f0);
      QPDFFormFieldObjectHelper(&local_150,(QPDFObjectHandle *)&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      bVar2 = isRadioButton(&local_150);
      if (bVar2) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_68,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)name);
        setRadioButtonValue(&local_150,(QPDFObjectHandle *)&local_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
        ~QPDFFormFieldObjectHelper(&local_150);
        goto LAB_00159b5e;
      }
      ~QPDFFormFieldObjectHelper(&local_150);
    }
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_170,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"/Kids",(allocator<char> *)(local_f0 + 0x18));
  QPDFObjectHandle::getKey(&local_a8,&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_170._M_string_length);
  bVar2 = isRadioButton(this);
  if (bVar2) {
    bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_f0);
    if (!bVar2) goto LAB_00159b08;
    bVar2 = QPDFObjectHandle::isArray(&local_a8);
    if (!bVar2) goto LAB_00159b08;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"/V",(allocator<char> *)&local_170);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x10),
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)name);
    setFieldAttribute(this,(string *)&local_150,(QPDFObjectHandle *)(local_88 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x18));
    std::__cxx11::string::~string((string *)&local_150);
    ::qpdf::Array::Array(&local_48,(shared_ptr<QPDFObject> *)&local_a8);
    key = ::qpdf::Array::begin(&local_48);
    local_f0._16_8_ = name;
    local_98 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1;
    local_90 = (string *)::qpdf::Array::end(&local_48);
    __return_storage_ptr__ = (string *)(local_f0 + 0x18);
    for (; (string *)key._M_current != local_90;
        key._M_current = (QPDFObjectHandle *)&((string *)key._M_current)->field_2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"/AP",(allocator<char> *)&local_170);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_88,(string *)key._M_current);
      std::__cxx11::string::~string((string *)&local_150);
      local_118._M_ptr = (element_type *)0x0;
      local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar2 = ::qpdf::BaseHandle::null((BaseHandle *)local_88);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"/Kids",(allocator<char> *)&local_100);
        QPDFObjectHandle::getKey
                  ((QPDFObjectHandle *)__return_storage_ptr__,(string *)key._M_current);
        ::qpdf::Array::Array((Array *)&local_170,(shared_ptr<QPDFObject> *)__return_storage_ptr__);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
        std::__cxx11::string::~string((string *)&local_150);
        key_00 = ::qpdf::Array::begin((Array *)&local_170);
        iVar3 = ::qpdf::Array::end((Array *)&local_170);
        for (; key_00._M_current != iVar3._M_current;
            key_00._M_current = (QPDFObjectHandle *)&((string *)key_00._M_current)->field_2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"/AP",(allocator<char> *)&local_100);
          QPDFObjectHandle::getKey
                    ((QPDFObjectHandle *)__return_storage_ptr__,(string *)key_00._M_current);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_88,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)
          ;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
          std::__cxx11::string::~string((string *)&local_150);
          bVar2 = ::qpdf::BaseHandle::null((BaseHandle *)local_88);
          if (!bVar2) {
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_118,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key_00._M_current);
            break;
          }
        }
        ::qpdf::Array::~Array((Array *)&local_170);
      }
      else {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_118,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key._M_current
                  );
      }
      if (local_118._M_ptr == (element_type *)0x0) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_170,local_98);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"unable to set the value of this radio button",
                   (allocator<char> *)__return_storage_ptr__);
        QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_170,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_170._M_string_length);
      }
      else {
        bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_88);
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"/N",&local_171);
          QPDFObjectHandle::getKey(&local_100,(string *)local_88);
          bVar2 = QPDFObjectHandle::isDictionary(&local_100);
          if (!bVar2) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_100.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            std::__cxx11::string::~string((string *)&local_150);
            goto LAB_00159a7b;
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"/N",&local_172);
          QPDFObjectHandle::getKey(&local_b8,(string *)local_88);
          QPDFObjectHandle::getName_abi_cxx11_
                    (__return_storage_ptr__,(QPDFObjectHandle *)local_f0._16_8_);
          bVar2 = QPDFObjectHandle::hasKey(&local_b8,__return_storage_ptr__);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_b8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string((string *)&local_170);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_100.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string((string *)&local_150);
          if (!bVar2) goto LAB_00159a7b;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"/AS",(allocator<char> *)&local_170);
          QPDFObjectHandle::replaceKey
                    ((QPDFObjectHandle *)&local_118,(string *)&local_150,
                     (QPDFObjectHandle *)local_f0._16_8_);
        }
        else {
LAB_00159a7b:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"/AS",(allocator<char> *)&local_100);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_170,"/Off",(allocator<char> *)&local_b8);
          QPDFObjectHandle::newName(__return_storage_ptr__);
          QPDFObjectHandle::replaceKey
                    ((QPDFObjectHandle *)&local_118,(string *)&local_150,
                     (QPDFObjectHandle *)__return_storage_ptr__);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
          std::__cxx11::string::~string((string *)&local_170);
        }
        std::__cxx11::string::~string((string *)&local_150);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    }
    ::qpdf::Array::~Array(&local_48);
  }
  else {
LAB_00159b08:
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_170,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,
               "don\'t know how to set the value of this field as a radio button",
               (allocator<char> *)(local_f0 + 0x18));
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_170,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_170._M_string_length);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_00159b5e:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::setRadioButtonValue(QPDFObjectHandle name)
{
    // Set the value of a radio button field. This has the following specific behavior:
    // * If this is a radio button field that has a parent that is also a radio button field and has
    //   no explicit /V, call itself on the parent
    // * If this is a radio button field with children, set /V to the given value. Then, for each
    //   child, if the child has the specified value as one of its keys in the /N subdictionary of
    //   its /AP (i.e. its normal appearance stream dictionary), set /AS to name; otherwise, if /Off
    //   is a member, set /AS to /Off.
    // Note that we never turn on /NeedAppearances when setting a radio button field.
    QPDFObjectHandle parent = oh().getKey("/Parent");
    if (parent.isDictionary() && parent.getKey("/Parent").isNull()) {
        QPDFFormFieldObjectHelper ph(parent);
        if (ph.isRadioButton()) {
            // This is most likely one of the individual buttons. Try calling on the parent.
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper set parent radio button");
            ph.setRadioButtonValue(name);
            return;
        }
    }

    QPDFObjectHandle kids = oh().getKey("/Kids");
    if (!(isRadioButton() && parent.isNull() && kids.isArray())) {
        oh().warnIfPossible("don't know how to set the value of this field as a radio button");
        return;
    }
    setFieldAttribute("/V", name);
    for (auto const& kid: kids.as_array()) {
        QPDFObjectHandle AP = kid.getKey("/AP");
        QPDFObjectHandle annot;
        if (AP.null()) {
            // The widget may be below. If there is more than one, just find the first one.
            for (auto const& grandkid: kid.getKey("/Kids").as_array()) {
                AP = grandkid.getKey("/AP");
                if (!AP.null()) {
                    QTC::TC("qpdf", "QPDFFormFieldObjectHelper radio button grandkid");
                    annot = grandkid;
                    break;
                }
            }
        } else {
            annot = kid;
        }
        if (!annot) {
            QTC::TC("qpdf", "QPDFObjectHandle broken radio button");
            oh().warnIfPossible("unable to set the value of this radio button");
            continue;
        }
        if (AP.isDictionary() && AP.getKey("/N").isDictionary() &&
            AP.getKey("/N").hasKey(name.getName())) {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper turn on radio button");
            annot.replaceKey("/AS", name);
        } else {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper turn off radio button");
            annot.replaceKey("/AS", QPDFObjectHandle::newName("/Off"));
        }
    }
}